

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O1

HighsStatus __thiscall
HighsIis::compute(HighsIis *this,HighsLp *lp,HighsOptions *options,HighsBasis *basis)

{
  pointer *ppHVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  iterator iVar4;
  pointer piVar5;
  pointer piVar6;
  HighsOptions *pHVar7;
  HighsStatus HVar8;
  HighsStatus HVar9;
  HighsLp *pHVar10;
  vector<int,_std::allocator<int>_> *pvVar11;
  vector<double,_std::allocator<double>_> *pvVar12;
  pointer __nbytes;
  _Alloc_hider __nbytes_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  char *pcVar13;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__buf_00;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *pvVar14;
  void *__buf_01;
  uint uVar15;
  HighsInt HVar16;
  int iVar17;
  ulong uVar18;
  char *pcVar19;
  HighsIis *pHVar20;
  long lVar21;
  HighsStatus HVar22;
  ulong __new_size;
  int iVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  ulong extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  ulong extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  string type;
  double check_lower;
  HighsInt check_num_nz;
  HighsInt check_num_ix;
  double check_upper;
  vector<double,_std::allocator<double>_> cost;
  double check_cost;
  Highs highs;
  double local_56a0;
  double local_5698;
  string local_5690;
  string local_5670;
  double local_5650;
  HighsIis *local_5648;
  HighsStatus local_563c;
  ulong local_5638;
  uint local_562c;
  uint local_5628;
  uint local_5624;
  HighsInt local_5620;
  HighsInt local_561c;
  vector<HighsIisInfo,std::allocator<HighsIisInfo>> *local_5618;
  ulong local_5610;
  HighsLogOptions *local_5608;
  vector<int,_std::allocator<int>_> *local_5600;
  vector<int,_std::allocator<int>_> *local_55f8;
  HighsOptions *local_55f0;
  HighsLp *local_55e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_55e0;
  vector<double,_std::allocator<double>_> *local_55d8;
  vector<double,_std::allocator<double>_> *local_55d0;
  vector<double,_std::allocator<double>_> *local_55c8;
  vector<double,_std::allocator<double>_> *local_55c0;
  ulong local_55b8;
  double local_55b0;
  vector<double,_std::allocator<double>_> local_55a8;
  double local_5590;
  HighsLp local_5588;
  Highs local_51f0;
  
  local_5628 = (options->super_HighsOptionsStruct).iis_strategy;
  if (0 < lp->num_col_) {
    HVar16 = 0;
    do {
      addCol(this,HVar16,0);
      HVar16 = HVar16 + 1;
    } while (HVar16 < lp->num_col_);
  }
  if (0 < lp->num_row_) {
    iVar17 = 0;
    do {
      addRow(this,iVar17,0);
      iVar17 = iVar17 + 1;
    } while (iVar17 < lp->num_row_);
  }
  Highs::Highs(&local_51f0);
  paVar2 = &local_5690.field_2;
  local_5690._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5690,"output_flag","");
  Highs::setOptionValue(&local_51f0,&local_5690,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5690._M_dataplus._M_p != paVar2) {
    operator_delete(local_5690._M_dataplus._M_p);
  }
  local_5690._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5690,"presolve","");
  Highs::setOptionValue(&local_51f0,&local_5690,&::kHighsOffString_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5690._M_dataplus._M_p != paVar2) {
    operator_delete(local_5690._M_dataplus._M_p);
  }
  HighsLp::HighsLp(&local_5588,lp);
  Highs::passModel(&local_51f0,&local_5588);
  HighsLp::~HighsLp(&local_5588);
  if (basis != (HighsBasis *)0x0) {
    local_5690._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5690,"");
    Highs::setBasis(&local_51f0,basis,&local_5690);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5690._M_dataplus._M_p != paVar2) {
      operator_delete(local_5690._M_dataplus._M_p);
    }
  }
  local_55a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_55a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_55a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5690._M_dataplus._M_p = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&local_55a8,(long)lp->num_col_,(value_type_conflict1 *)&local_5690);
  __nbytes = local_55a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  Highs::changeColsCost
            (&local_51f0,0,lp->num_col_ + -1,
             local_55a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  pvVar14 = extraout_RDX;
  if (basis != (HighsBasis *)0x0) {
    local_5690._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5690,"");
    Highs::setBasis(&local_51f0,basis,&local_5690);
    pvVar14 = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5690._M_dataplus._M_p != paVar2) {
      operator_delete(local_5690._M_dataplus._M_p);
      pvVar14 = extraout_RDX_01;
    }
  }
  local_5690._M_dataplus._M_p = (pointer)0x0;
  local_5690._M_string_length._0_4_ = 0;
  HighsTimer::read(&local_51f0.timer_,0,pvVar14,(size_t)__nbytes);
  local_5690._M_dataplus._M_p = (pointer)(extraout_XMM0_Qa ^ 0x8000000000000000);
  local_5690._M_string_length._0_4_ =
       -local_51f0.info_.super_HighsInfoStruct.simplex_iteration_count;
  HVar8 = Highs::run(&local_51f0);
  if (HVar8 == kOk) {
    HighsTimer::read(&local_51f0.timer_,0,__buf,(size_t)__nbytes);
    local_5690._M_dataplus._M_p = (pointer)(extraout_XMM0_Qa_00 + local_5690._M_dataplus._M_p);
    local_5690._M_string_length._0_4_ =
         (int)local_5690._M_string_length +
         local_51f0.info_.super_HighsInfoStruct.simplex_iteration_count;
    iVar4._M_current =
         (this->info_).super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->info_).super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<HighsIisInfo,std::allocator<HighsIisInfo>>::_M_realloc_insert<HighsIisInfo_const&>
                ((vector<HighsIisInfo,std::allocator<HighsIisInfo>> *)&this->info_,iVar4,
                 (HighsIisInfo *)&local_5690);
    }
    else {
      (iVar4._M_current)->simplex_time = (double)local_5690._M_dataplus._M_p;
      *(ulong *)&(iVar4._M_current)->simplex_iterations =
           CONCAT44(local_5690._M_string_length._4_4_,(int)local_5690._M_string_length);
      ppHVar1 = &(this->info_).super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppHVar1 = *ppHVar1 + 1;
    }
    local_5608 = &(options->super_HighsOptionsStruct).log_options;
    local_5618 = (vector<HighsIisInfo,std::allocator<HighsIisInfo>> *)&this->info_;
    local_55e8 = (HighsLp *)&lp->num_row_;
    local_55f8 = &this->row_bound_;
    local_5600 = &this->col_bound_;
    local_55c0 = &lp->row_lower_;
    local_55c8 = &lp->col_lower_;
    local_55d0 = &lp->row_upper_;
    local_55d8 = &lp->col_upper_;
    local_5610 = 0;
    local_5638 = 0;
    local_5648 = this;
    local_55f0 = options;
    do {
      local_5690._M_dataplus._M_p = (pointer)&local_5690.field_2;
      bVar24 = local_5628 != 0;
      uVar15 = (uint)local_5638 | local_5628;
      bVar25 = uVar15 == 0;
      bVar26 = (uint)local_5638 == 1;
      pcVar19 = "Col";
      if (bVar26 && bVar24 || bVar25) {
        pcVar19 = "Row";
      }
      pcVar13 = "";
      if (bVar26 && bVar24 || bVar25) {
        pcVar13 = "";
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5690,pcVar19,pcVar13);
      pHVar10 = lp;
      if (bVar26 && bVar24 || bVar25) {
        pHVar10 = local_55e8;
      }
      local_5624 = uVar15;
      if (0 < pHVar10->num_col_) {
        local_562c = -(uint)(bVar26 && bVar24 || bVar25) | 1;
        local_55b8 = (ulong)(uint)pHVar10->num_col_;
        __nbytes_00._M_p = (pointer)0x38;
        if (bVar26 && bVar24 || bVar25) {
          __nbytes_00._M_p = (pointer)0x50;
        }
        uVar18 = 0;
        local_55e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)__nbytes_00._M_p;
        do {
          pvVar11 = local_5600;
          if (bVar26 && bVar24 || bVar25) {
            pvVar11 = local_55f8;
          }
          iVar17 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar18];
          iVar23 = 0xd;
          if ((iVar17 != -1) && (iVar17 != 1)) {
            pvVar12 = local_55c8;
            if (bVar26 && bVar24 || bVar25) {
              pvVar12 = local_55c0;
            }
            local_5698 = (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar18];
            pvVar12 = local_55d8;
            if (bVar26 && bVar24 || bVar25) {
              pvVar12 = local_55d0;
            }
            local_56a0 = (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar18];
            HVar16 = (HighsInt)uVar18;
            if (local_5698 != -INFINITY) {
              if (bVar26 && bVar24 || bVar25) {
                Highs::changeRowBounds(&local_51f0,HVar16,-INFINITY,local_56a0);
                pvVar14 = extraout_RDX_02;
              }
              else {
                Highs::changeColBounds(&local_51f0,HVar16,-INFINITY,local_56a0);
                pvVar14 = extraout_RDX_03;
              }
              local_5670._M_dataplus._M_p = (pointer)0x0;
              local_5670._M_string_length._0_4_ = 0;
              HighsTimer::read(&local_51f0.timer_,0,pvVar14,(size_t)__nbytes_00._M_p);
              local_5670._M_dataplus._M_p = (pointer)(extraout_XMM0_Qa_01 ^ 0x8000000000000000);
              local_5670._M_string_length._0_4_ =
                   -local_51f0.info_.super_HighsInfoStruct.simplex_iteration_count;
              HVar9 = Highs::run(&local_51f0);
              HVar22 = HVar9;
              if (HVar9 == kOk) {
                HighsTimer::read(&local_51f0.timer_,0,__buf_00,(size_t)__nbytes_00._M_p);
                local_5670._M_dataplus._M_p =
                     (pointer)(extraout_XMM0_Qa_02 + local_5670._M_dataplus._M_p);
                local_5670._M_string_length._0_4_ =
                     (int)local_5670._M_string_length +
                     local_51f0.info_.super_HighsInfoStruct.simplex_iteration_count;
                iVar4._M_current =
                     (local_5648->info_).
                     super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar4._M_current ==
                    (local_5648->info_).
                    super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<HighsIisInfo,std::allocator<HighsIisInfo>>::
                  _M_realloc_insert<HighsIisInfo_const&>
                            (local_5618,iVar4,(HighsIisInfo *)&local_5670);
                }
                else {
                  (iVar4._M_current)->simplex_time = (double)local_5670._M_dataplus._M_p;
                  *(ulong *)&(iVar4._M_current)->simplex_iterations =
                       CONCAT44(local_5670._M_string_length._4_4_,(int)local_5670._M_string_length);
                  ppHVar1 = &(local_5648->info_).
                             super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl
                             .super__Vector_impl_data._M_finish;
                  *ppHVar1 = *ppHVar1 + 1;
                }
                HVar22 = HVar8;
                if (local_51f0.model_status_ == kOptimal) {
                  if (bVar26 && bVar24 || bVar25) {
                    Highs::changeRowBounds(&local_51f0,HVar16,local_5698,local_56a0);
                  }
                  else {
                    Highs::changeColBounds(&local_51f0,HVar16,local_5698,local_56a0);
                  }
                  if (local_56a0 != INFINITY) {
                    if (bVar26 && bVar24 || bVar25) {
                      Highs::changeRowBounds(&local_51f0,HVar16,local_5698,INFINITY);
                      local_56a0 = INFINITY;
                    }
                    else {
                      Highs::changeColBounds(&local_51f0,HVar16,local_5698,INFINITY);
                      local_56a0 = INFINITY;
                    }
                  }
                }
                else {
                  local_5698 = -INFINITY;
                }
              }
              iVar23 = 1;
              HVar8 = HVar22;
              local_563c = HVar22;
              if (HVar9 != kOk) goto LAB_0022ae4e;
            }
            local_563c = HVar8;
            if (local_56a0 == INFINITY) {
              local_5650 = local_56a0;
            }
            else {
              if (bVar26 && bVar24 || bVar25) {
                Highs::changeRowBounds(&local_51f0,HVar16,local_5698,INFINITY);
                pvVar14 = extraout_RDX_04;
              }
              else {
                Highs::changeColBounds(&local_51f0,HVar16,local_5698,INFINITY);
                pvVar14 = extraout_RDX_05;
              }
              local_5670._M_dataplus._M_p = (pointer)0x0;
              local_5670._M_string_length._0_4_ = 0;
              HighsTimer::read(&local_51f0.timer_,0,pvVar14,(size_t)__nbytes_00._M_p);
              local_5670._M_dataplus._M_p = (pointer)(extraout_XMM0_Qa_03 ^ 0x8000000000000000);
              local_5670._M_string_length._0_4_ =
                   -local_51f0.info_.super_HighsInfoStruct.simplex_iteration_count;
              HVar8 = Highs::run(&local_51f0);
              if (HVar8 != kOk) {
                iVar23 = 1;
                goto LAB_0022ae4e;
              }
              HighsTimer::read(&local_51f0.timer_,0,__buf_01,(size_t)__nbytes_00._M_p);
              local_5670._M_dataplus._M_p =
                   (pointer)(extraout_XMM0_Qa_04 + local_5670._M_dataplus._M_p);
              local_5670._M_string_length._0_4_ =
                   (int)local_5670._M_string_length +
                   local_51f0.info_.super_HighsInfoStruct.simplex_iteration_count;
              iVar4._M_current =
                   (local_5648->info_).
                   super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (local_5648->info_).
                  super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<HighsIisInfo,std::allocator<HighsIisInfo>>::
                _M_realloc_insert<HighsIisInfo_const&>(local_5618,iVar4,(HighsIisInfo *)&local_5670)
                ;
              }
              else {
                (iVar4._M_current)->simplex_time = (double)local_5670._M_dataplus._M_p;
                *(ulong *)&(iVar4._M_current)->simplex_iterations =
                     CONCAT44(local_5670._M_string_length._4_4_,(int)local_5670._M_string_length);
                ppHVar1 = &(local_5648->info_).
                           super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppHVar1 = *ppHVar1 + 1;
              }
              local_5650 = INFINITY;
              if (local_51f0.model_status_ == kOptimal) {
                if (bVar26 && bVar24 || bVar25) {
                  Highs::changeRowBounds(&local_51f0,HVar16,local_5698,local_56a0);
                  local_5650 = local_56a0;
                }
                else {
                  Highs::changeColBounds(&local_51f0,HVar16,local_5698,local_56a0);
                  local_5650 = local_56a0;
                }
              }
            }
            if (bVar26 && bVar24 || bVar25) {
              pHVar20 = (HighsIis *)(uVar18 & 0xffffffff);
              Highs::getRows(&local_51f0,HVar16,HVar16,&local_561c,(double *)&local_5670,&local_55b0
                             ,&local_5620,(HighsInt *)0x0,(HighsInt *)0x0,(double *)0x0);
            }
            else {
              pHVar20 = (HighsIis *)(uVar18 & 0xffffffff);
              Highs::getCols(&local_51f0,HVar16,HVar16,&local_561c,&local_5590,(double *)&local_5670
                             ,&local_55b0,&local_5620,(HighsInt *)0x0,(HighsInt *)0x0,(double *)0x0)
              ;
            }
            __nbytes_00._M_p = local_5690._M_dataplus._M_p;
            if (-INFINITY < local_5698) {
              uVar15 = (uint)(local_5650 < INFINITY) * 2 + 2;
            }
            else {
              uVar15 = local_562c;
              if (local_5650 < INFINITY) {
                uVar15 = 3;
              }
            }
            *(uint *)(*(long *)(local_55e0->_M_local_buf + (long)&local_5648->valid_) + uVar18 * 4)
                 = uVar15;
            iisBoundStatusToString_abi_cxx11_(&local_5670,pHVar20,uVar15);
            highsLogUser(local_5608,kInfo,"%s %d has status %s\n",__nbytes_00._M_p,
                         uVar18 & 0xffffffff,local_5670._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5670._M_dataplus._M_p != &local_5670.field_2) {
              operator_delete(local_5670._M_dataplus._M_p);
            }
            iVar23 = 0;
            HVar8 = local_563c;
          }
LAB_0022ae4e:
          if ((iVar23 != 0xd) && (pHVar20 = local_5648, iVar23 != 0)) goto LAB_0022b07f;
          uVar18 = uVar18 + 1;
        } while (local_55b8 != uVar18);
      }
      pHVar20 = local_5648;
      iVar23 = 0;
      if ((int)local_5638 == 1) {
        iVar23 = 10;
      }
      if (((int)local_5638 != 1 && local_5624 == 0) && (iVar23 = 0, 0 < lp->num_col_)) {
        uVar18 = 0;
        do {
          piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar17 = piVar5[uVar18];
          iVar3 = piVar5[uVar18 + 1];
          if (iVar17 < iVar3) {
            lVar21 = 0;
            do {
              if ((pHVar20->row_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar17 + lVar21]] != -1) goto LAB_0022b061;
              lVar21 = lVar21 + 1;
            } while (iVar3 - iVar17 != (int)lVar21);
          }
          highsLogUser(local_5608,kInfo,"Col %d has status Dropped: Empty\n",uVar18 & 0xffffffff);
          (pHVar20->col_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar18] = -1;
          Highs::changeColBounds(&local_51f0,(HighsInt)uVar18,-INFINITY,INFINITY);
LAB_0022b061:
          uVar18 = uVar18 + 1;
        } while ((long)uVar18 < (long)lp->num_col_);
      }
LAB_0022b07f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5690._M_dataplus._M_p != &local_5690.field_2) {
        operator_delete(local_5690._M_dataplus._M_p);
      }
      pHVar7 = local_55f0;
      if ((iVar23 != 10) && (iVar23 != 0)) break;
      iVar17 = (int)local_5638;
      local_5610 = CONCAT71((int7)(local_5638 >> 8),iVar17 != 0);
      local_5638 = (ulong)(iVar17 + 1);
    } while (iVar17 == 0);
    if ((local_5610 & 1) != 0) {
      uVar18 = 0;
      if (0 < lp->num_col_) {
        piVar5 = (pHVar20->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (pHVar20->col_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar21 = 0;
        do {
          if (piVar6[lVar21] != -1) {
            iVar17 = (int)uVar18;
            piVar5[iVar17] = piVar5[lVar21];
            piVar6[iVar17] = piVar6[lVar21];
            uVar18 = (ulong)(iVar17 + 1);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < lp->num_col_);
        uVar18 = (ulong)(int)uVar18;
      }
      __new_size = 0;
      if (0 < lp->num_row_) {
        piVar5 = (pHVar20->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (pHVar20->row_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar21 = 0;
        do {
          if (piVar6[lVar21] != -1) {
            iVar17 = (int)__new_size;
            piVar5[iVar17] = piVar5[lVar21];
            piVar6[iVar17] = piVar6[lVar21];
            __new_size = (ulong)(iVar17 + 1);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < lp->num_row_);
        __new_size = (ulong)(int)__new_size;
      }
      std::vector<int,_std::allocator<int>_>::resize(&pHVar20->col_index_,uVar18);
      std::vector<int,_std::allocator<int>_>::resize(local_5600,uVar18);
      std::vector<int,_std::allocator<int>_>::resize(&pHVar20->row_index_,__new_size);
      std::vector<int,_std::allocator<int>_>::resize(local_55f8,__new_size);
      pHVar20->valid_ = true;
      pHVar20->strategy_ = (pHVar7->super_HighsOptionsStruct).iis_strategy;
      HVar8 = kOk;
    }
  }
  if (local_55a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (double *)0x0) {
    operator_delete(local_55a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Highs::~Highs(&local_51f0);
  return HVar8;
}

Assistant:

HighsStatus HighsIis::compute(const HighsLp& lp, const HighsOptions& options,
                              const HighsBasis* basis) {
  const HighsLogOptions& log_options = options.log_options;
  const bool row_priority =
      //      options.iis_strategy == kIisStrategyFromRayRowPriority ||
      options.iis_strategy == kIisStrategyFromLpRowPriority;
  // Initially all columns and rows are candidates for the IIS
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) this->addCol(iCol);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) this->addRow(iRow);
  Highs highs;
  const HighsInfo& info = highs.getInfo();
  highs.setOptionValue("output_flag", kIisDevReport);
  highs.setOptionValue("presolve", kHighsOffString);
  const HighsLp& incumbent_lp = highs.getLp();
  const HighsBasis& incumbent_basis = highs.getBasis();
  const HighsSolution& solution = highs.getSolution();
  HighsStatus run_status = highs.passModel(lp);
  assert(run_status == HighsStatus::kOk);
  if (basis) highs.setBasis(*basis);

  // Zero the objective
  std::vector<double> cost;
  cost.assign(lp.num_col_, 0);
  run_status = highs.changeColsCost(0, lp.num_col_ - 1, cost.data());
  assert(run_status == HighsStatus::kOk);
  // Solve the LP
  if (basis) highs.setBasis(*basis);
  const bool use_sensitivity_filter = false;
  std::vector<double> primal_phase1_dual;
  bool row_deletion = false;
  HighsInt iX = -1;
  bool drop_lower = false;

  // Lambda for gathering data when solving an LP
  auto solveLp = [&]() -> HighsStatus {
    HighsIisInfo iis_info;
    iis_info.simplex_time = -highs.getRunTime();
    iis_info.simplex_iterations = -info.simplex_iteration_count;
    run_status = highs.run();
    assert(run_status == HighsStatus::kOk);
    if (run_status != HighsStatus::kOk) return run_status;
    HighsModelStatus model_status = highs.getModelStatus();
    if (use_sensitivity_filter &&
        model_status == HighsModelStatus::kInfeasible) {
      printf("\nHighsIis::compute %s deletion for %d and %s bound\n",
             row_deletion ? "Row" : "Col", int(iX),
             drop_lower ? "Lower" : "Upper");
      bool output_flag;
      highs.getOptionValue("output_flag", output_flag);
      highs.setOptionValue("output_flag", true);
      HighsInt simplex_strategy;
      highs.getOptionValue("simplex_strategy", simplex_strategy);
      highs.setOptionValue("simplex_strategy", kSimplexStrategyPrimal);
      // Solve the LP
      run_status = highs.run();
      if (run_status != HighsStatus::kOk) return run_status;
      highs.writeSolution("", kSolutionStylePretty);
      const HighsInt* basic_index = highs.getBasicVariablesArray();
      std::vector<double> rhs;
      rhs.assign(lp.num_row_, 0);
      // Get duals for nonbasic rows, and initialise duals so that basic duals
      // are zero
      assert(101 == 202);

      for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
        HighsInt iVar = basic_index[iRow];
        const double lower = iVar < lp.num_col_
                                 ? lp.col_lower_[iVar]
                                 : lp.row_lower_[iVar - lp.num_col_];
        const double upper = iVar < lp.num_col_
                                 ? lp.col_upper_[iVar]
                                 : lp.row_upper_[iVar - lp.num_col_];
        const double value = iVar < lp.num_col_
                                 ? solution.col_value[iVar]
                                 : solution.row_value[iVar - lp.num_col_];
        if (value < lower - options.primal_feasibility_tolerance) {
          rhs[iRow] = -1;
        } else if (value > upper + options.primal_feasibility_tolerance) {
          rhs[iRow] = 1;
        }
      }
      HVector pi;
      pi.setup(lp.num_row_);
      highs.getBasisTransposeSolve(rhs.data(), &pi.array[0], NULL, NULL);
      pi.count = lp.num_row_;
      std::vector<double> reduced_costs_value;
      std::vector<HighsInt> reduced_costs_index;
      lp.a_matrix_.productTransposeQuad(reduced_costs_value,
                                        reduced_costs_index, pi);

      primal_phase1_dual = highs.getPrimalPhase1Dual();
      HighsInt num_zero_dual = 0;
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        const HighsBasisStatus status = incumbent_basis.col_status[iCol];
        const double dual = primal_phase1_dual[iCol];
        const double lower = lp.col_lower_[iCol];
        const double upper = lp.col_upper_[iCol];
        const double value = solution.col_value[iCol];
        if (status != HighsBasisStatus::kBasic &&
            std::fabs(dual) < options.dual_feasibility_tolerance) {
          num_zero_dual++;
          // Small dual for nonbasic variable
          printf(
              "HighsIis::compute Column %d [%g, %g, %g] with status %s has "
              "dual %g\n",
              int(iCol), lower, value, upper,
              highs.basisStatusToString(status).c_str(), dual);
          //	  assert(123 == 456);
        }
      }
      for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
        const HighsBasisStatus status = incumbent_basis.row_status[iRow];
        const double dual = primal_phase1_dual[lp.num_col_ + iRow];
        const double lower = lp.row_lower_[iRow];
        const double upper = lp.row_upper_[iRow];
        const double value = solution.row_value[iRow];
        if (status != HighsBasisStatus::kBasic &&
            std::fabs(dual) < options.dual_feasibility_tolerance) {
          num_zero_dual++;
          // Small dual for nonbasic variable
          printf(
              "HighsIis::compute Row    %d [%g, %g, %g] with status %s has "
              "dual %g\n",
              int(iRow), lower, value, upper,
              highs.basisStatusToString(status).c_str(), dual);
          //	  assert(123 == 456);
        }
      }
      highs.setOptionValue("output_flag", output_flag);
      highs.setOptionValue("simplex_strategy", simplex_strategy);
      assert(!num_zero_dual);
    }
    iis_info.simplex_time += highs.getRunTime();
    iis_info.simplex_iterations += info.simplex_iteration_count;
    this->info_.push_back(iis_info);
    return run_status;
  };

  run_status = solveLp();
  if (run_status != HighsStatus::kOk) return run_status;

  assert(highs.getModelStatus() == HighsModelStatus::kInfeasible);

  // Pass twice: rows before columns, or columns before rows, according to
  // row_priority
  for (HighsInt k = 0; k < 2; k++) {
    row_deletion = (row_priority && k == 0) || (!row_priority && k == 1);
    std::string type = row_deletion ? "Row" : "Col";
    // Perform deletion pass
    HighsInt num_index = row_deletion ? lp.num_row_ : lp.num_col_;
    for (iX = 0; iX < num_index; iX++) {
      const HighsInt ix_status =
          row_deletion ? this->row_bound_[iX] : this->col_bound_[iX];
      if (ix_status == kIisBoundStatusDropped ||
          ix_status == kIisBoundStatusFree)
        continue;
      double lower = row_deletion ? lp.row_lower_[iX] : lp.col_lower_[iX];
      double upper = row_deletion ? lp.row_upper_[iX] : lp.col_upper_[iX];
      // Record whether the upper bound has been dropped due to the lower bound
      // being kept
      if (lower > -kHighsInf) {
        // Drop the lower bound temporarily
        bool drop_lower = true;
        run_status = row_deletion
                         ? highs.changeRowBounds(iX, -kHighsInf, upper)
                         : highs.changeColBounds(iX, -kHighsInf, upper);
        assert(run_status == HighsStatus::kOk);
        // Solve the LP
        run_status = solveLp();
        if (run_status != HighsStatus::kOk) return run_status;
        HighsModelStatus model_status = highs.getModelStatus();
        if (model_status == HighsModelStatus::kOptimal) {
          // Now feasible, so restore the lower bound
          run_status = row_deletion ? highs.changeRowBounds(iX, lower, upper)
                                    : highs.changeColBounds(iX, lower, upper);
          assert(run_status == HighsStatus::kOk);
          // If the lower bound must be kept, then any finite upper bound
          // must be dropped
          const bool apply_reciprocal_rule = true;
          if (apply_reciprocal_rule) {
            if (upper < kHighsInf) {
              // Drop the upper bound permanently
              upper = kHighsInf;
              run_status = row_deletion
                               ? highs.changeRowBounds(iX, lower, upper)
                               : highs.changeColBounds(iX, lower, upper);
              assert(run_status == HighsStatus::kOk);
            }
            assert(upper >= kHighsInf);
            // Since upper = kHighsInf, allow the loop to run so that
            // bound status is set as if upper were set to kHighsInf
            // by relaxing it and finding that the LP was still
            // infeasible
          }
        } else {
          // Bound can be dropped permanently
          assert(model_status == HighsModelStatus::kInfeasible);
          lower = -kHighsInf;
        }
      }
      if (upper < kHighsInf) {
        // Drop the upper bound temporarily
        run_status = row_deletion ? highs.changeRowBounds(iX, lower, kHighsInf)
                                  : highs.changeColBounds(iX, lower, kHighsInf);
        assert(run_status == HighsStatus::kOk);
        // Solve the LP
        run_status = solveLp();
        if (run_status != HighsStatus::kOk) return run_status;
        HighsModelStatus model_status = highs.getModelStatus();
        if (model_status == HighsModelStatus::kOptimal) {
          // Now feasible, so restore the upper bound
          run_status = row_deletion ? highs.changeRowBounds(iX, lower, upper)
                                    : highs.changeColBounds(iX, lower, upper);
          assert(run_status == HighsStatus::kOk);
        } else {
          // Bound can be dropped permanently
          assert(model_status == HighsModelStatus::kInfeasible);
          upper = kHighsInf;
        }
      }
      const bool debug_bound_change = true;
      if (debug_bound_change) {
        // Check bounds have been changed correctly
        double check_lower;
        double check_upper;
        double check_cost;
        HighsInt check_num_ix;
        HighsInt check_num_nz;
        run_status =
            row_deletion
                ? highs.getRows(iX, iX, check_num_ix, &check_lower,
                                &check_upper, check_num_nz, nullptr, nullptr,
                                nullptr)
                : highs.getCols(iX, iX, check_num_ix, &check_cost, &check_lower,
                                &check_upper, check_num_nz, nullptr, nullptr,
                                nullptr);
        assert(run_status == HighsStatus::kOk);
        assert(check_lower == lower);
        assert(check_upper == upper);
      }
      HighsInt iss_bound_status = kIisBoundStatusNull;
      if (lower <= -kHighsInf) {
        if (upper >= kHighsInf) {
          if (row_deletion) {
            // Free rows can be dropped
            iss_bound_status = kIisBoundStatusDropped;
          } else {
            // Free columns can only be dropped if they are empty
            iss_bound_status = kIisBoundStatusFree;
          }
        } else {
          iss_bound_status = kIisBoundStatusUpper;
        }
      } else {
        if (upper >= kHighsInf) {
          iss_bound_status = kIisBoundStatusLower;
        } else {
          // FX or BX: shouldn't happen
          iss_bound_status = kIisBoundStatusBoxed;
        }
      }
      assert(iss_bound_status != kIisBoundStatusNull);
      assert(iss_bound_status != kIisBoundStatusBoxed);
      if (row_deletion) {
        this->row_bound_[iX] = iss_bound_status;
      } else {
        this->col_bound_[iX] = iss_bound_status;
      }
      highsLogUser(log_options, HighsLogType::kInfo, "%s %d has status %s\n",
                   type.c_str(), int(iX),
                   iisBoundStatusToString(iss_bound_status).c_str());
    }
    if (k == 1) continue;
    // End of first pass: look to simplify second pass
    if (kIisDevReport) this->report("End of deletion", incumbent_lp);
    if (row_deletion) {
      // Mark empty columns as dropped
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        bool empty_col = true;
        for (HighsInt iEl = lp.a_matrix_.start_[iCol];
             iEl < lp.a_matrix_.start_[iCol + 1]; iEl++) {
          if (this->row_bound_[lp.a_matrix_.index_[iEl]] !=
              kIisBoundStatusDropped) {
            empty_col = false;
            break;
          }
        }
        if (empty_col) {
          highsLogUser(log_options, HighsLogType::kInfo,
                       "Col %d has status Dropped: Empty\n", int(iCol));
          this->col_bound_[iCol] = kIisBoundStatusDropped;
          run_status = highs.changeColBounds(iCol, -kHighsInf, kHighsInf);
          assert(run_status == HighsStatus::kOk);
        }
      }
    }
    if (kIisDevReport) this->report("End of pass 1", incumbent_lp);
  }
  if (kIisDevReport) this->report("End of pass 2", incumbent_lp);
  HighsInt iss_num_col = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (this->col_bound_[iCol] != kIisBoundStatusDropped) {
      this->col_index_[iss_num_col] = this->col_index_[iCol];
      this->col_bound_[iss_num_col] = this->col_bound_[iCol];
      iss_num_col++;
    }
  }
  HighsInt iss_num_row = 0;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (this->row_bound_[iRow] != kIisBoundStatusDropped) {
      this->row_index_[iss_num_row] = this->row_index_[iRow];
      this->row_bound_[iss_num_row] = this->row_bound_[iRow];
      iss_num_row++;
    }
  }
  this->col_index_.resize(iss_num_col);
  this->col_bound_.resize(iss_num_col);
  this->row_index_.resize(iss_num_row);
  this->row_bound_.resize(iss_num_row);
  this->valid_ = true;
  this->strategy_ = options.iis_strategy;
  return HighsStatus::kOk;
}